

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O3

bool __thiscall
bssl::tls13_write_psk_binder
          (bssl *this,SSL_HANDSHAKE *hs,SSLTranscript *transcript,Span<unsigned_char> msg,
          size_t *out_binder_len)

{
  long lVar1;
  size_t *out_len;
  Span<const_unsigned_char> client_hello;
  bool bVar2;
  int iVar3;
  EVP_MD *md;
  undefined4 extraout_var;
  uchar *binders_len;
  undefined1 in_stack_ffffffffffffff68;
  size_t verify_data_len;
  uint8_t verify_data [64];
  uchar *__n;
  
  binders_len = msg.data_;
  lVar1 = *(long *)this;
  md = (EVP_MD *)ssl_session_get_digest(*(SSL_SESSION **)(lVar1 + 0x58));
  iVar3 = EVP_MD_size(md);
  __n = (uchar *)CONCAT44(extraout_var,iVar3);
  out_len = *(size_t **)(lVar1 + 0x58);
  iVar3 = SSL_is_dtls(*(SSL **)this);
  client_hello.size_._0_1_ = iVar3 != 0;
  client_hello.data_ = __n + 3;
  client_hello.size_._1_7_ = 0;
  bVar2 = tls13_psk_binder((bssl *)verify_data,(uint8_t *)&verify_data_len,out_len,(SSL_SESSION *)hs
                           ,transcript,client_hello,(size_t)binders_len,
                           (bool)in_stack_ffffffffffffff68);
  if ((uchar *)verify_data_len == __n && bVar2) {
    if (binders_len < __n) {
      abort();
    }
    if (__n != (uchar *)0x0) {
      memcpy(binders_len + ((long)&transcript->buffer_ - (long)__n),verify_data,(size_t)__n);
    }
    if ((size_t *)msg.size_ != (size_t *)0x0) {
      *(size_t *)msg.size_ = (size_t)__n;
    }
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x253);
  }
  return (uchar *)verify_data_len == __n && bVar2;
}

Assistant:

bool tls13_write_psk_binder(const SSL_HANDSHAKE *hs,
                            const SSLTranscript &transcript, Span<uint8_t> msg,
                            size_t *out_binder_len) {
  const SSL *const ssl = hs->ssl;
  const EVP_MD *digest = ssl_session_get_digest(ssl->session.get());
  const size_t hash_len = EVP_MD_size(digest);
  // We only offer one PSK, so the binders are a u16 and u8 length
  // prefix, followed by the binder. The caller is assumed to have constructed
  // |msg| with placeholder binders.
  const size_t binders_len = 3 + hash_len;
  uint8_t verify_data[EVP_MAX_MD_SIZE];
  size_t verify_data_len;
  if (!tls13_psk_binder(verify_data, &verify_data_len, ssl->session.get(),
                        transcript, msg, binders_len, SSL_is_dtls(hs->ssl)) ||
      verify_data_len != hash_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto msg_binder = msg.last(verify_data_len);
  OPENSSL_memcpy(msg_binder.data(), verify_data, verify_data_len);
  if (out_binder_len != nullptr) {
    *out_binder_len = verify_data_len;
  }
  return true;
}